

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O0

double __thiscall SharedMatting::aP(SharedMatting *this,int i,int j,double pf,Scalar *f,Scalar *b)

{
  double dVar1;
  Scalar_<double> local_c8;
  Scalar_<double> local_a8;
  Scalar_<double> local_88;
  double alpha;
  Scalar c;
  int rc;
  int gc;
  int bc;
  Scalar *b_local;
  Scalar *f_local;
  double pf_local;
  int j_local;
  int i_local;
  SharedMatting *this_local;
  
  c.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_ =
       (uint)this->data[i * this->step + j * this->channels + 2];
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)&alpha,(double)this->data[i * this->step + j * this->channels],
             (double)this->data[i * this->step + j * this->channels + 1],
             (double)c.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_,0.0);
  cv::Scalar_<double>::Scalar_(&local_88,(Scalar_<double> *)&alpha);
  cv::Scalar_<double>::Scalar_(&local_a8,f);
  cv::Scalar_<double>::Scalar_(&local_c8,b);
  dVar1 = comalpha(this,&local_88,&local_a8,&local_c8);
  return (1.0 - (pf + pf)) * dVar1 + pf;
}

Assistant:

double SharedMatting::aP(int i, int j, double pf, Scalar f, Scalar b)
{
    int bc = data[i * step + j * channels];
    int gc = data[i * step + j * channels + 1];
    int rc = data[i * step + j * channels + 2];
    Scalar c = Scalar(bc, gc, rc);

    double alpha = comalpha(c, f, b);

    return pf + (1 - 2 * pf) * alpha;
}